

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_step.c
# Opt level: O0

cupdlp_retcode PDHG_Init_Step_Sizes(CUPDLPwork *pdhg)

{
  long *plVar1;
  long lVar2;
  int *piVar3;
  cupdlp_retcode cVar4;
  undefined8 *in_RDI;
  double dVar5;
  double dVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  cupdlp_float b_1;
  cupdlp_float a_1;
  cupdlp_float b;
  cupdlp_float a;
  CUPDLPstepsize *stepsize;
  CUPDLPiterates *iterates;
  CUPDLPproblem *problem;
  cupdlp_retcode retcode;
  cupdlp_float *in_stack_ffffffffffffffa8;
  cupdlp_float *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  cupdlp_int n;
  CUPDLPwork *in_stack_ffffffffffffffc0;
  CUPDLPwork *w;
  
  n = (cupdlp_int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  plVar1 = (long *)*in_RDI;
  lVar2 = in_RDI[3];
  piVar3 = (int *)in_RDI[4];
  if (*piVar3 == 0) {
    cVar4 = PDHG_Power_Method((CUPDLPwork *)b,(cupdlp_float *)a_1);
    if (cVar4 != 0) {
      return 1;
    }
    cupdlp_twoNormSquared
              (in_stack_ffffffffffffffc0,n,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    cupdlp_twoNormSquared
              (in_stack_ffffffffffffffc0,n,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    piVar3[10] = 0;
    piVar3[0xb] = 0x3ff00000;
    dVar5 = sqrt(*(double *)(piVar3 + 2));
    *(double *)(piVar3 + 2) = 0.8 / dVar5;
    *(undefined8 *)(piVar3 + 4) = *(undefined8 *)(piVar3 + 2);
    dVar5 = sqrt(*(double *)(piVar3 + 10));
    *(double *)(piVar3 + 2) = *(double *)(piVar3 + 2) / dVar5;
    dVar5 = sqrt(*(double *)(piVar3 + 10));
    *(double *)(piVar3 + 4) = dVar5 * *(double *)(piVar3 + 4);
  }
  else {
    piVar3[0xc] = 0;
    piVar3[0xd] = 0x3ff00000;
    w = (CUPDLPwork *)0x0;
    dVar5 = 0.0;
    cupdlp_twoNormSquared((CUPDLPwork *)0x0,0,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    cupdlp_twoNormSquared
              (w,(cupdlp_int)((ulong)dVar5 >> 0x20),in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffa8);
    uVar7 = SUB84(dVar5,0);
    uVar8 = (int)((ulong)dVar5 >> 0x20);
    if ((double)w <= dVar5) {
      uVar7 = (int)w;
      uVar8 = (int)((ulong)w >> 0x20);
    }
    if ((double)(~-(ulong)NAN((double)w) & CONCAT44(uVar8,uVar7) |
                -(ulong)NAN((double)w) & (ulong)dVar5) <= 1e-06) {
      piVar3[10] = 0;
      piVar3[0xb] = 0x3ff00000;
    }
    else {
      *(double *)(piVar3 + 10) = (double)w / dVar5;
    }
    dVar5 = 1.0 / *(double *)(*(long *)(*plVar1 + 0x20) + 0x28);
    dVar6 = sqrt(*(double *)(piVar3 + 10));
    *(double *)(piVar3 + 2) = dVar5 / dVar6;
    *(double *)(piVar3 + 4) = *(double *)(piVar3 + 2) * *(double *)(piVar3 + 10);
    *(undefined8 *)(lVar2 + 0x18) = *(undefined8 *)(piVar3 + 10);
  }
  *(undefined4 *)(lVar2 + 8) = 0;
  piVar3[6] = 0;
  piVar3[7] = 0;
  piVar3[8] = 0;
  piVar3[9] = 0;
  return 0;
}

Assistant:

cupdlp_retcode PDHG_Init_Step_Sizes(CUPDLPwork *pdhg) {
  cupdlp_retcode retcode = RETCODE_OK;

  CUPDLPproblem *problem = pdhg->problem;
  CUPDLPiterates *iterates = pdhg->iterates;
  CUPDLPstepsize *stepsize = pdhg->stepsize;

  if (stepsize->eLineSearchMethod == PDHG_FIXED_LINESEARCH) {
    CUPDLP_CALL(PDHG_Power_Method(pdhg, &stepsize->dPrimalStep));
    // PDLP Intial primal weight = norm(cost) / norm(rhs) = sqrt(beta)
    // cupdlp_float a = twoNormSquared(problem->cost, problem->nCols);
    // cupdlp_float b = twoNormSquared(problem->rhs, problem->nRows);
    cupdlp_float a = 0.0;
    cupdlp_float b = 0.0;
    cupdlp_twoNormSquared(pdhg, problem->nCols, problem->cost, &a);
    cupdlp_twoNormSquared(pdhg, problem->nRows, problem->rhs, &b);

    if (fmin(a, b) > 1e-6) {
      stepsize->dBeta = a / b;
    } else {
      stepsize->dBeta = 1.0;
    }

    stepsize->dPrimalStep = 0.8 / sqrt(stepsize->dPrimalStep);
    stepsize->dDualStep = stepsize->dPrimalStep;
    stepsize->dPrimalStep /= sqrt(stepsize->dBeta);
    stepsize->dDualStep *= sqrt(stepsize->dBeta);
  } else {
    stepsize->dTheta = 1.0;

    // PDLP Intial primal weight = norm(cost) / norm(rhs) = sqrt(beta)
    // cupdlp_float a = twoNormSquared(problem->cost, problem->nCols);
    // cupdlp_float b = twoNormSquared(problem->rhs, problem->nRows);
    cupdlp_float a = 0.0;
    cupdlp_float b = 0.0;
    cupdlp_twoNormSquared(pdhg, problem->nCols, problem->cost, &a);
    cupdlp_twoNormSquared(pdhg, problem->nRows, problem->rhs, &b);

    if (fmin(a, b) > 1e-6) {
      stepsize->dBeta = a / b;
    } else {
      stepsize->dBeta = 1.0;
    }
    // infNorm can be avoid by previously calculated infNorm of csc matrix
    stepsize->dPrimalStep =
        // (1.0 / infNorm(problem->data->csc_matrix->colMatElem,
        // problem->data->csc_matrix->nMatElem)) /
        (1.0 / problem->data->csc_matrix->MatElemNormInf) /
        sqrt(stepsize->dBeta);
    stepsize->dDualStep = stepsize->dPrimalStep * stepsize->dBeta;
    iterates->dLastRestartBeta = stepsize->dBeta;
  }

  iterates->iLastRestartIter = 0;
  stepsize->dSumPrimalStep = 0;
  stepsize->dSumDualStep = 0;

exit_cleanup:
  return retcode;
}